

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcast_unsigned_converters.hpp
# Opt level: O0

bool __thiscall
boost::detail::lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
          (lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *this)

{
  bool bVar1;
  locale *plVar2;
  ulong uVar3;
  char *pcVar4;
  lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *in_RDI;
  char remained;
  char thousands_sep;
  uchar current_grouping;
  size_type grouping_size;
  string *grouping;
  numpunct *np;
  locale loc;
  char czero;
  lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *in_stack_ffffffffffffff68;
  char local_6b;
  char_type local_6a;
  byte local_69;
  long local_68;
  string local_60 [32];
  string *local_40;
  numpunct *local_38;
  undefined4 local_30;
  locale local_20 [15];
  undefined1 local_11;
  bool local_1;
  
  local_11 = 0x30;
  in_RDI->m_end = in_RDI->m_end + -1;
  *in_RDI->m_value = 0;
  if (((in_RDI->m_end < in_RDI->m_begin) || (*in_RDI->m_end < '0')) || ('9' < *in_RDI->m_end)) {
    local_1 = false;
    goto LAB_002b065a;
  }
  *in_RDI->m_value = (int)*in_RDI->m_end - 0x30;
  in_RDI->m_end = in_RDI->m_end + -1;
  std::locale::locale(local_20);
  plVar2 = (locale *)std::locale::classic();
  uVar3 = std::locale::operator==(local_20,plVar2);
  if ((uVar3 & 1) == 0) {
    local_38 = std::use_facet<std::__cxx11::numpunct<char>>(local_20);
    std::__cxx11::numpunct<char>::grouping();
    local_40 = local_60;
    local_68 = std::__cxx11::string::size();
    if (local_68 == 0) {
LAB_002b04c4:
      local_1 = main_convert_loop(in_stack_ffffffffffffff68);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if (*pcVar4 < '\x01') goto LAB_002b04c4;
      local_69 = 0;
      local_6a = std::__cxx11::numpunct<char>::thousands_sep();
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      local_6b = *pcVar4 + -1;
      while (in_RDI->m_begin <= in_RDI->m_end) {
        if (local_6b == '\0') {
          bVar1 = std::char_traits<char>::eq(in_RDI->m_end,&local_6a);
          if (!bVar1) {
            local_1 = main_convert_loop(in_stack_ffffffffffffff68);
            goto LAB_002b0638;
          }
          if (in_RDI->m_begin == in_RDI->m_end) {
            local_1 = false;
            goto LAB_002b0638;
          }
          if ((ulong)local_69 < local_68 - 1U) {
            local_69 = local_69 + 1;
          }
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
          local_6b = *pcVar4;
        }
        else {
          bVar1 = main_convert_iteration(in_RDI);
          if (!bVar1) {
            local_1 = false;
            goto LAB_002b0638;
          }
          local_6b = local_6b + -1;
        }
        in_RDI->m_end = in_RDI->m_end + -1;
      }
      local_1 = true;
    }
LAB_002b0638:
    local_30 = 1;
    std::__cxx11::string::~string(local_60);
  }
  else {
    local_1 = main_convert_loop(in_stack_ffffffffffffff68);
    local_30 = 1;
  }
  std::locale::~locale(local_20);
LAB_002b065a:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool convert() {
                CharT const czero = lcast_char_constants<CharT>::zero;
                --m_end;
                m_value = static_cast<T>(0);

                if (m_begin > m_end || *m_end < czero || *m_end >= czero + 10)
                    return false;
                m_value = static_cast<T>(*m_end - czero);
                --m_end;

#ifdef BOOST_LEXICAL_CAST_ASSUME_C_LOCALE
                return main_convert_loop();
#else
                std::locale loc;
                if (loc == std::locale::classic()) {
                    return main_convert_loop();
                }

                typedef std::numpunct<CharT> numpunct;
                numpunct const& np = BOOST_USE_FACET(numpunct, loc);
                std::string const& grouping = np.grouping();
                std::string::size_type const grouping_size = grouping.size();

                /* According to Programming languages - C++
                 * we MUST check for correct grouping
                 */
                if (!grouping_size || grouping[0] <= 0) {
                    return main_convert_loop();
                }

                unsigned char current_grouping = 0;
                CharT const thousands_sep = np.thousands_sep();
                char remained = static_cast<char>(grouping[current_grouping] - 1);

                for (;m_end >= m_begin; --m_end)
                {
                    if (remained) {
                        if (!main_convert_iteration()) {
                            return false;
                        }
                        --remained;
                    } else {
                        if ( !Traits::eq(*m_end, thousands_sep) ) //|| begin == end ) return false;
                        {
                            /*
                             * According to Programming languages - C++
                             * Digit grouping is checked. That is, the positions of discarded
                             * separators is examined for consistency with
                             * use_facet<numpunct<charT> >(loc ).grouping()
                             *
                             * BUT what if there is no separators at all and grouping()
                             * is not empty? Well, we have no extraced separators, so we
                             * won`t check them for consistency. This will allow us to
                             * work with "C" locale from other locales
                             */
                            return main_convert_loop();
                        } else {
                            if (m_begin == m_end) return false;
                            if (current_grouping < grouping_size - 1) ++current_grouping;
                            remained = grouping[current_grouping];
                        }
                    }
                } /*for*/

                return true;
#endif
            }